

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl.c
# Opt level: O0

QDLDL_int QDLDL_factor(QDLDL_int n,QDLDL_int *Ap,QDLDL_int *Ai,QDLDL_float *Ax,QDLDL_int *Lp,
                      QDLDL_int *Li,QDLDL_float *Lx,QDLDL_float *D,QDLDL_float *Dinv,QDLDL_int *Lnz,
                      QDLDL_int *etree,QDLDL_bool *bwork,QDLDL_int *iwork,QDLDL_float *fwork)

{
  double dVar1;
  long lVar2;
  QDLDL_int *pQVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  QDLDL_int *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  long in_R9;
  QDLDL_int i;
  long in_stack_00000038;
  long in_stack_00000040;
  ulong local_b8;
  QDLDL_int positiveValuesInD;
  QDLDL_bool *yMarkers;
  QDLDL_float yVals_cidx;
  QDLDL_float *yVals;
  QDLDL_int *LNextSpaceInCol;
  QDLDL_int *elimBuffer;
  QDLDL_int *yIdx;
  QDLDL_int tmpIdx;
  QDLDL_int nnzE;
  QDLDL_int nextIdx;
  QDLDL_int cidx;
  QDLDL_int bidx;
  QDLDL_int nnzY;
  QDLDL_int k;
  QDLDL_int j;
  
  plVar6 = (long *)(in_stack_00000038 + in_RDI * 8);
  lVar7 = in_stack_00000038 + in_RDI * 0x10;
  *in_R8 = 0;
  for (tmpIdx = 0; tmpIdx < in_RDI; tmpIdx = tmpIdx + 1) {
    in_R8[tmpIdx + 1] = in_R8[tmpIdx] + Ai[tmpIdx];
    *(undefined1 *)(n + tmpIdx) = 0;
    *(undefined8 *)(in_stack_00000040 + tmpIdx * 8) = 0;
    Lp[tmpIdx] = 0;
    *(undefined8 *)(lVar7 + tmpIdx * 8) = in_R8[tmpIdx];
  }
  *Lp = *in_RCX;
  if (((double)*Lp != 0.0) || (NAN((double)*Lp))) {
    local_b8 = (ulong)(0.0 < (double)*Lp);
    *Ax = 1.0 / (double)*Lp;
    for (elimBuffer = (QDLDL_int *)0x1; (long)elimBuffer < in_RDI;
        elimBuffer = (QDLDL_int *)((long)elimBuffer + 1)) {
      LNextSpaceInCol = (QDLDL_int *)0x0;
      lVar2 = *(long *)(in_RSI + 8 + (long)elimBuffer * 8);
      for (tmpIdx = *(QDLDL_int *)(in_RSI + (long)elimBuffer * 8); tmpIdx < lVar2;
          tmpIdx = tmpIdx + 1) {
        pQVar3 = *(QDLDL_int **)(in_RDX + tmpIdx * 8);
        if (pQVar3 == elimBuffer) {
          Lp[(long)elimBuffer] = in_RCX[tmpIdx];
        }
        else {
          *(QDLDL_int *)(in_stack_00000040 + (long)pQVar3 * 8) = in_RCX[tmpIdx];
          if (*(char *)(n + (long)pQVar3) == '\0') {
            *(undefined1 *)(n + (long)pQVar3) = 1;
            *plVar6 = (long)pQVar3;
            positiveValuesInD = 1;
            for (yMarkers = (QDLDL_bool *)Ap[(long)pQVar3];
                (yMarkers != (QDLDL_bool *)0xffffffffffffffff && (long)yMarkers < (long)elimBuffer
                && (yMarkers[n] != '\x01')); yMarkers = (QDLDL_bool *)Ap[(long)yMarkers]) {
              yMarkers[n] = '\x01';
              plVar6[positiveValuesInD] = (long)yMarkers;
              positiveValuesInD = positiveValuesInD + 1;
            }
            while (positiveValuesInD != 0) {
              *(long *)(in_stack_00000038 + (long)LNextSpaceInCol * 8) =
                   plVar6[positiveValuesInD + -1];
              positiveValuesInD = positiveValuesInD + -1;
              LNextSpaceInCol = (QDLDL_int *)((long)LNextSpaceInCol + 1);
            }
          }
        }
      }
      while (tmpIdx = (long)LNextSpaceInCol + -1, -1 < tmpIdx) {
        lVar2 = *(long *)(in_stack_00000038 + tmpIdx * 8);
        lVar4 = *(long *)(lVar7 + lVar2 * 8);
        dVar1 = *(double *)(in_stack_00000040 + lVar2 * 8);
        for (yIdx = (QDLDL_int *)in_R8[lVar2]; (long)yIdx < lVar4;
            yIdx = (QDLDL_int *)((long)yIdx + 1)) {
          lVar5 = *(long *)(in_R9 + (long)yIdx * 8);
          *(double *)(in_stack_00000040 + lVar5 * 8) =
               -(double)Li[(long)yIdx] * dVar1 + *(double *)(in_stack_00000040 + lVar5 * 8);
        }
        *(QDLDL_int **)(in_R9 + lVar4 * 8) = elimBuffer;
        Li[lVar4] = (QDLDL_int)(dVar1 * Ax[lVar2]);
        Lp[(long)elimBuffer] =
             (QDLDL_int)(-dVar1 * (double)Li[lVar4] + (double)Lp[(long)elimBuffer]);
        *(long *)(lVar7 + lVar2 * 8) = *(long *)(lVar7 + lVar2 * 8) + 1;
        *(undefined8 *)(in_stack_00000040 + lVar2 * 8) = 0;
        *(undefined1 *)(n + lVar2) = 0;
        LNextSpaceInCol = (QDLDL_int *)tmpIdx;
      }
      if (((double)Lp[(long)elimBuffer] == 0.0) && (!NAN((double)Lp[(long)elimBuffer]))) {
        return -1;
      }
      if (0.0 < (double)Lp[(long)elimBuffer]) {
        local_b8 = local_b8 + 1;
      }
      Ax[(long)elimBuffer] = 1.0 / (double)Lp[(long)elimBuffer];
    }
    j = local_b8;
  }
  else {
    j = -1;
  }
  return j;
}

Assistant:

QDLDL_int QDLDL_factor(const QDLDL_int    n,
                  const QDLDL_int*   Ap,
                  const QDLDL_int*   Ai,
                  const QDLDL_float* Ax,
                  QDLDL_int*   Lp,
                  QDLDL_int*   Li,
                  QDLDL_float* Lx,
                  QDLDL_float* D,
                  QDLDL_float* Dinv,
                  const QDLDL_int* Lnz,
                  const QDLDL_int* etree,
                  QDLDL_bool*  bwork,
                  QDLDL_int*   iwork,
                  QDLDL_float* fwork){

  QDLDL_int i,j,k,nnzY, bidx, cidx, nextIdx, nnzE, tmpIdx;
  QDLDL_int *yIdx, *elimBuffer, *LNextSpaceInCol;
  QDLDL_float *yVals;
  QDLDL_float yVals_cidx;
  QDLDL_bool  *yMarkers;
  QDLDL_int   positiveValuesInD = 0;

  //partition working memory into pieces
  yMarkers        = bwork;
  yIdx            = iwork;
  elimBuffer      = iwork + n;
  LNextSpaceInCol = iwork + n*2;
  yVals           = fwork;


  Lp[0] = 0; //first column starts at index zero

  for(i = 0; i < n; i++){

    //compute L column indices
    Lp[i+1] = Lp[i] + Lnz[i];   //cumsum, total at the end

    // set all Yidx to be 'unused' initially
    //in each column of L, the next available space
    //to start is just the first space in the column
    yMarkers[i]  = QDLDL_UNUSED;
    yVals[i]     = 0.0;
    D[i]         = 0.0;
    LNextSpaceInCol[i] = Lp[i];
  }

  // First element of the diagonal D.
  D[0]     = Ax[0];
  if(D[0] == 0.0){return -1;}
  if(D[0]  > 0.0){positiveValuesInD++;}
  Dinv[0] = 1/D[0];

  //Start from 1 here. The upper LH corner is trivially 0
  //in L b/c we are only computing the subdiagonal elements
  for(k = 1; k < n; k++){

    //NB : For each k, we compute a solution to
    //y = L(0:(k-1),0:k-1))\b, where b is the kth
    //column of A that sits above the diagonal.
    //The solution y is then the kth row of L,
    //with an implied '1' at the diagonal entry.

    //number of nonzeros in this row of L
    nnzY = 0;  //number of elements in this row

    //This loop determines where nonzeros
    //will go in the kth row of L, but doesn't
    //compute the actual values
    tmpIdx = Ap[k+1];

    for(i = Ap[k]; i < tmpIdx; i++){

      bidx = Ai[i];   // we are working on this element of b

      //Initialize D[k] as the element of this column
      //corresponding to the diagonal place.  Don't use
      //this element as part of the elimination step
      //that computes the k^th row of L
      if(bidx == k){
        D[k] = Ax[i];
        continue;
      }

      yVals[bidx] = Ax[i];   // initialise y(bidx) = b(bidx)

      // use the forward elimination tree to figure
      // out which elements must be eliminated after
      // this element of b
      nextIdx = bidx;

      if(yMarkers[nextIdx] == QDLDL_UNUSED){   //this y term not already visited

        yMarkers[nextIdx] = QDLDL_USED;     //I touched this one
        elimBuffer[0]     = nextIdx;  // It goes at the start of the current list
        nnzE              = 1;         //length of unvisited elimination path from here

        nextIdx = etree[bidx];

        while(nextIdx != QDLDL_UNKNOWN && nextIdx < k){
          if(yMarkers[nextIdx] == QDLDL_USED) break;

          yMarkers[nextIdx] = QDLDL_USED;   //I touched this one
          elimBuffer[nnzE] = nextIdx; //It goes in the current list
          nnzE++;                     //the list is one longer than before
          nextIdx = etree[nextIdx];   //one step further along tree

        } //end while

        // now I put the buffered elimination list into
        // my current ordering in reverse order
        while(nnzE){
          yIdx[nnzY++] = elimBuffer[--nnzE];
        } //end while
      } //end if

    } //end for i

    //This for loop places nonzeros values in the k^th row
    for(i = (nnzY-1); i >=0; i--){

      //which column are we working on?
      cidx = yIdx[i];

      // loop along the elements in this
      // column of L and subtract to solve to y
      tmpIdx = LNextSpaceInCol[cidx];
      yVals_cidx = yVals[cidx];
      for(j = Lp[cidx]; j < tmpIdx; j++){
        yVals[Li[j]] -= Lx[j]*yVals_cidx;
      }

      //Now I have the cidx^th element of y = L\b.
      //so compute the corresponding element of
      //this row of L and put it into the right place
      Li[tmpIdx] = k;
      Lx[tmpIdx] = yVals_cidx *Dinv[cidx];

      //D[k] -= yVals[cidx]*yVals[cidx]*Dinv[cidx];
      D[k] -= yVals_cidx*Lx[tmpIdx];
      LNextSpaceInCol[cidx]++;

      //reset the yvalues and indices back to zero and QDLDL_UNUSED
      //once I'm done with them
      yVals[cidx]     = 0.0;
      yMarkers[cidx]  = QDLDL_UNUSED;

    } //end for i

    //Maintain a count of the positive entries
    //in D.  If we hit a zero, we can't factor
    //this matrix, so abort
    if(D[k] == 0.0){return -1;}
    if(D[k]  > 0.0){positiveValuesInD++;}

    //compute the inverse of the diagonal
    Dinv[k]= 1/D[k];

  } //end for k

  return positiveValuesInD;

}